

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmByteArraySource::CVmByteArraySource(CVmByteArraySource *this,vm_obj_id_t arr)

{
  CVmObject *pCVar1;
  _func_int **pp_Var2;
  undefined4 in_ESI;
  CVmDataSource *in_RDI;
  
  CVmDataSource::CVmDataSource(in_RDI);
  in_RDI->_vptr_CVmDataSource = (_func_int **)&PTR__CVmByteArraySource_003e0468;
  in_RDI[6]._vptr_CVmDataSource = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[1]._vptr_CVmDataSource = in_ESI;
  pCVar1 = vm_objp(0);
  in_RDI[2]._vptr_CVmDataSource = (_func_int **)pCVar1;
  in_RDI[3]._vptr_CVmDataSource = (_func_int **)0x0;
  in_RDI[4]._vptr_CVmDataSource = (_func_int **)0x0;
  pp_Var2 = (_func_int **)CVmObjByteArray::get_element_count((CVmObjByteArray *)0x2c7681);
  in_RDI[5]._vptr_CVmDataSource = pp_Var2;
  return;
}

Assistant:

CVmByteArraySource(VMG_ vm_obj_id_t arr)
    {
        /* remember the array and globals */
        this->vmg = VMGLOB_ADDR;
        this->arr_id = arr;
        this->arr = (CVmObjByteArray *)vm_objp(vmg_ arr);

        /* we provide access to the entire range of the array */
        this->idx = 0;
        this->start_idx = 0;
        this->end_idx = this->arr->get_element_count();
    }